

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11Texture.cpp
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmGen11TextureCalc::GetMipTailByteOffset
          (GmmGen11TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel)

{
  SKU_FEATURE_TABLE *pSVar1;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_2c;
  uint32_t local_28;
  uint32_t Slot;
  uint32_t ByteOffset;
  uint32_t MipLevel_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen11TextureCalc *this_local;
  
  local_28 = 0;
  local_2c = 0xff;
  pSVar1 = Context::GetSkuTable
                     ((this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.
                      super_GmmTextureCalc.pGmmLibContext);
  if (((ulong)pSVar1->field_1 >> 0xf & 1) == 0) {
    this_local._4_4_ =
         GmmGen9TextureCalc::GetMipTailByteOffset((GmmGen9TextureCalc *)this,pTexInfo,MipLevel);
  }
  else {
    if ((pTexInfo->Type == RESOURCE_1D) || (pTexInfo->Type == RESOURCE_3D)) {
      local_2c = 0;
      if ((SUB84((pTexInfo->Flags).Info,4) >> 5 & 1) != 0) {
        local_2c = 4;
      }
      local_2c = (MipLevel - (pTexInfo->Alignment).MipTailStartLod) + local_2c;
    }
    else if ((pTexInfo->Type == RESOURCE_2D) || (pTexInfo->Type == RESOURCE_CUBE)) {
      if ((((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0) ||
         ((pTexInfo->MSAA).NumSamples != 0x10)) {
        if ((((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0) || ((pTexInfo->MSAA).NumSamples != 8)
           ) {
          if ((((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0) ||
             ((pTexInfo->MSAA).NumSamples != 4)) {
            if ((((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0) ||
               ((pTexInfo->MSAA).NumSamples != 2)) {
              if ((SUB84((pTexInfo->Flags).Info,4) >> 6 & 1) == 0) {
                if ((((ulong)(pTexInfo->Flags).Info >> 0x25 & 1) == 0) ||
                   ((pTexInfo->MSAA).NumSamples != 0x10)) {
                  if ((((ulong)(pTexInfo->Flags).Info >> 0x25 & 1) == 0) ||
                     ((pTexInfo->MSAA).NumSamples != 8)) {
                    if ((((ulong)(pTexInfo->Flags).Info >> 0x25 & 1) == 0) ||
                       ((pTexInfo->MSAA).NumSamples != 4)) {
                      if ((((ulong)(pTexInfo->Flags).Info >> 0x25 & 1) == 0) ||
                         ((pTexInfo->MSAA).NumSamples != 2)) {
                        local_60 = 0;
                        if ((SUB84((pTexInfo->Flags).Info,4) >> 5 & 1) != 0) {
                          local_60 = 4;
                        }
                      }
                      else {
                        local_60 = 5;
                      }
                      local_5c = local_60;
                    }
                    else {
                      local_5c = 8;
                    }
                    local_58 = local_5c;
                  }
                  else {
                    local_58 = 10;
                  }
                  local_54 = local_58;
                }
                else {
                  local_54 = 0xb;
                }
                local_50 = local_54;
              }
              else {
                local_50 = 0;
              }
              local_4c = local_50;
            }
            else {
              local_4c = 1;
            }
            local_48 = local_4c;
          }
          else {
            local_48 = 2;
          }
          local_44 = local_48;
        }
        else {
          local_44 = 3;
        }
        local_40 = local_44;
      }
      else {
        local_40 = 4;
      }
      local_2c = (MipLevel - (pTexInfo->Alignment).MipTailStartLod) + local_40;
    }
    switch(local_2c) {
    case 0:
      local_28 = 0x8000;
      break;
    case 1:
      local_28 = 0x4000;
      break;
    case 2:
      local_28 = 0x2000;
      break;
    case 3:
      local_28 = 0x1000;
      break;
    case 4:
      local_28 = 0x800;
      break;
    case 5:
      local_28 = 0x600;
      break;
    case 6:
      local_28 = 0x500;
      break;
    case 7:
      local_28 = 0x400;
      break;
    case 8:
      local_28 = 0x300;
      break;
    case 9:
      local_28 = 0x200;
      break;
    case 10:
      local_28 = 0x100;
      break;
    case 0xb:
      local_28 = 0;
      break;
    case 0xc:
      local_28 = 0x40;
      break;
    case 0xd:
      local_28 = 0x80;
      break;
    case 0xe:
      local_28 = 0xc4;
    }
    this_local._4_4_ = local_28;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t GmmLib::GmmGen11TextureCalc::GetMipTailByteOffset(GMM_TEXTURE_INFO *pTexInfo,
                                                           uint32_t          MipLevel)
{
    uint32_t ByteOffset = 0, Slot = 0xff;

    GMM_DPF_ENTER;

    // 3D textures follow the Gen10 mip tail format
    if(!pGmmLibContext->GetSkuTable().FtrStandardMipTailFormat)
    {
        return GmmGen9TextureCalc::GetMipTailByteOffset(pTexInfo, MipLevel);
    }

    if((pTexInfo->Type == RESOURCE_1D) || (pTexInfo->Type == RESOURCE_3D))
    {
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
               (pTexInfo->Flags.Info.TiledYf ? 4 : 0);
    }
    else if(pTexInfo->Type == RESOURCE_2D || pTexInfo->Type == RESOURCE_CUBE)
    {
        // clang-format off
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
                    // TileYs
                   ((pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 16) ? 4 :
                    (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples ==  8) ? 3 :
                    (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples ==  4) ? 2 :
                    (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples ==  2) ? 1 :
                    (pTexInfo->Flags.Info.TiledYs                                   ) ? 0 :
                    // TileYf
                    (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 16) ? 11:
                    (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples ==  8) ? 10:
                    (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples ==  4) ?  8:
                    (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples ==  2) ?  5:
                    (pTexInfo->Flags.Info.TiledYf                                   ) ?  4: 0);
        // clang-format on
    }

    switch(Slot)
    {
        case 0:
            ByteOffset = GMM_KBYTE(32);
            break;
        case 1:
            ByteOffset = GMM_KBYTE(16);
            break;
        case 2:
            ByteOffset = GMM_KBYTE(8);
            break;
        case 3:
            ByteOffset = GMM_KBYTE(4);
            break;
        case 4:
            ByteOffset = GMM_KBYTE(2);
            break;
        case 5:
            ByteOffset = GMM_BYTES(1536);
            break;
        case 6:
            ByteOffset = GMM_BYTES(1280);
            break;
        case 7:
            ByteOffset = GMM_BYTES(1024);
            break;
        case 8:
            ByteOffset = GMM_BYTES(768);
            break;
        case 9:
            ByteOffset = GMM_BYTES(512);
            break;
        case 10:
            ByteOffset = GMM_BYTES(256);
            break;
        case 11:
            ByteOffset = GMM_BYTES(0);
            break;
        case 12:
            ByteOffset = GMM_BYTES(64);
            break;
        case 13:
            ByteOffset = GMM_BYTES(128);
            break;
        case 14:
            ByteOffset = GMM_BYTES(196);
            break;
        default:
            __GMM_ASSERT(0);
    }

    GMM_DPF_EXIT;

    return (ByteOffset);
}